

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Driver.c
# Opt level: O2

DdNode * Llb_DriverPhaseCube(Aig_Man_t *pAig,Vec_Int_t *vDriRefs,DdManager *dd)

{
  abctime aVar1;
  ulong uVar2;
  int iVar3;
  DdNode *n;
  void *pvVar4;
  DdNode *pDVar5;
  int iVar6;
  int i;
  
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  n = Cudd_ReadOne(dd);
  Cudd_Ref(n);
  iVar6 = 0;
  while( true ) {
    i = -1;
    if (pAig->nRegs <= iVar6) {
      Cudd_Deref(n);
      dd->TimeStop = aVar1;
      return n;
    }
    pvVar4 = Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar6);
    iVar3 = i;
    if (*(ulong *)((long)pvVar4 + 8) != 0) {
      iVar3 = *(int *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x24);
    }
    iVar3 = Vec_IntEntry(vDriRefs,iVar3);
    if (iVar3 < 1) break;
    iVar3 = i;
    if (*(ulong *)((long)pvVar4 + 8) != 0) {
      iVar3 = *(int *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x24);
    }
    iVar3 = Vec_IntEntry(vDriRefs,iVar3);
    pDVar5 = n;
    if ((iVar3 == 1) && (uVar2 = *(ulong *)((long)pvVar4 + 8), (uVar2 & 1) != 0)) {
      if (uVar2 != 0) {
        i = *(int *)((uVar2 & 0xfffffffffffffffe) + 0x24);
      }
      pDVar5 = Cudd_bddIthVar(dd,i);
      pDVar5 = Cudd_bddAnd(dd,n,pDVar5);
      Cudd_Ref(pDVar5);
      Cudd_RecursiveDeref(dd,n);
    }
    iVar6 = iVar6 + 1;
    n = pDVar5;
  }
  __assert_fail("Vec_IntEntry( vDriRefs, Aig_ObjFaninId0(pObj) ) >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Driver.c"
                ,0x8a,"DdNode *Llb_DriverPhaseCube(Aig_Man_t *, Vec_Int_t *, DdManager *)");
}

Assistant:

DdNode * Llb_DriverPhaseCube( Aig_Man_t * pAig, Vec_Int_t * vDriRefs, DdManager * dd )
{
    DdNode * bCube, * bVar, * bTemp;
    Aig_Obj_t * pObj;
    int i;
    abctime TimeStop;
    TimeStop = dd->TimeStop; dd->TimeStop = 0;
    bCube = Cudd_ReadOne( dd );  Cudd_Ref( bCube );
    Saig_ManForEachLi( pAig, pObj, i )
    {
        assert( Vec_IntEntry( vDriRefs, Aig_ObjFaninId0(pObj) ) >= 1 );
        if ( Vec_IntEntry( vDriRefs, Aig_ObjFaninId0(pObj) ) != 1 )
            continue;
        if ( !Aig_ObjFaninC0(pObj) )
            continue;
        bVar  = Cudd_bddIthVar( dd, Aig_ObjFaninId0(pObj) );
        bCube = Cudd_bddAnd( dd, bTemp = bCube, bVar );  Cudd_Ref( bCube );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bCube );
    dd->TimeStop = TimeStop;
    return bCube;
}